

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O1

Abc_Cex_t * Abc_CexTransformTempor(Abc_Cex_t *p,int nPisOld,int nPosOld,int nRegsOld)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Abc_Cex_t *__s;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  
  iVar1 = p->iFrame;
  iVar2 = p->nPis;
  iVar4 = iVar2 / nPisOld;
  if (iVar1 < 1) {
    __assert_fail("p->iFrame > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                  ,0x1a4,"Abc_Cex_t *Abc_CexTransformTempor(Abc_Cex_t *, int, int, int)");
  }
  if (iVar2 % nPisOld != 0) {
    __assert_fail("p->nPis % nPisOld == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                  ,0x1a5,"Abc_Cex_t *Abc_CexTransformTempor(Abc_Cex_t *, int, int, int)");
  }
  uVar5 = (iVar4 + iVar1) * nPisOld + nRegsOld;
  __size = (long)(int)((((int)uVar5 >> 5) + 1) - (uint)((uVar5 & 0x1f) == 0)) * 4 + 0x14;
  __s = (Abc_Cex_t *)malloc(__size);
  iVar8 = 0;
  memset(__s,0,__size);
  __s->nRegs = nRegsOld;
  __s->nPis = nPisOld;
  __s->nBits = uVar5;
  __s->iPo = p->iPo;
  __s->iFrame = iVar4 + -1 + iVar1;
  if (1 < iVar4) {
    iVar3 = 0;
    iVar6 = nPisOld;
    do {
      if (0 < nPisOld) {
        uVar5 = p->nRegs + iVar6;
        iVar7 = nPisOld;
        do {
          if (((uint)(&p[1].iPo)[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) {
            (&__s[1].iPo)[nRegsOld >> 5] =
                 (&__s[1].iPo)[nRegsOld >> 5] | 1 << ((byte)nRegsOld & 0x1f);
          }
          nRegsOld = nRegsOld + 1;
          uVar5 = uVar5 + 1;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      iVar3 = iVar3 + 1;
      iVar6 = iVar6 + nPisOld;
    } while (iVar3 != iVar4 + -1);
  }
  iVar4 = 0;
  do {
    if (0 < nPisOld) {
      uVar5 = p->nRegs + iVar8;
      iVar6 = nPisOld;
      do {
        if (((uint)(&p[1].iPo)[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) {
          (&__s[1].iPo)[nRegsOld >> 5] = (&__s[1].iPo)[nRegsOld >> 5] | 1 << ((byte)nRegsOld & 0x1f)
          ;
        }
        nRegsOld = nRegsOld + 1;
        uVar5 = uVar5 + 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    iVar8 = iVar8 + iVar2;
    bVar9 = iVar4 != iVar1;
    iVar4 = iVar4 + 1;
  } while (bVar9);
  if (nRegsOld != __s->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                  ,0x1b1,"Abc_Cex_t *Abc_CexTransformTempor(Abc_Cex_t *, int, int, int)");
  }
  return __s;
}

Assistant:

Abc_Cex_t * Abc_CexTransformTempor( Abc_Cex_t * p, int nPisOld, int nPosOld, int nRegsOld )
{
    Abc_Cex_t * pCex;
    int i, k, iBit = nRegsOld, nFrames = p->nPis / nPisOld - 1;
    assert( p->iFrame > 0 ); // otherwise tempor did not properly check for failures in the prefix
    assert( p->nPis % nPisOld == 0 );
    pCex = Abc_CexAlloc( nRegsOld, nPisOld, nFrames + p->iFrame + 1 );
    pCex->iPo    = p->iPo;
    pCex->iFrame = nFrames + p->iFrame;
    for ( i = 0; i < nFrames; i++ )
        for ( k = 0; k < nPisOld; k++, iBit++ )
            if ( Abc_InfoHasBit(p->pData, p->nRegs + (i+1)*nPisOld + k) )
                Abc_InfoSetBit( pCex->pData, iBit );
    for ( i = 0; i <= p->iFrame; i++ )
        for ( k = 0; k < nPisOld; k++, iBit++ )
            if ( Abc_InfoHasBit(p->pData, p->nRegs + i*p->nPis + k) )
                Abc_InfoSetBit( pCex->pData, iBit );
    assert( iBit == pCex->nBits );
    return pCex;
}